

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GridDataType2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType2 *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pfVar3;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_1e0;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GridDataType2 *local_18;
  GridDataType2 *this_local;
  
  local_18 = this;
  this_local = (GridDataType2 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  GridData::GetAsString_abi_cxx11_(&local_1c0,&this->super_GridData);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"GridDataType2:");
  poVar2 = std::operator<<(poVar2,"\n\tNumber Of Values: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ushort *)&(this->super_GridData).field_0xc);
  std::operator<<(poVar2,"\n\tValues: ");
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<float,_std::allocator<float>_>::begin(&this->m_vf32Values);
  local_1e0._M_current =
       (float *)std::vector<float,_std::allocator<float>_>::end(&this->m_vf32Values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_1e0);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190," ");
    pfVar3 = __gnu_cxx::
             __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&citrEnd);
    std::ostream::operator<<(poVar2,*pfVar3);
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(&citrEnd);
  }
  std::operator<<(local_190,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType2::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType2:"
       << "\n\tNumber Of Values: " << m_ui16NumValues
       << "\n\tValues: ";

    vector<KFLOAT32>::const_iterator citr = m_vf32Values.begin();
    vector<KFLOAT32>::const_iterator citrEnd = m_vf32Values.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << *citr;
    }
    ss << "\n";

    return ss.str();
}